

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O0

FunctionBody * __thiscall Js::Utf8SourceInfo::FindFunction(Utf8SourceInfo *this,LocalFunctionId id)

{
  bool bVar1;
  SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  **ppSVar2;
  SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *this_00;
  FunctionBody *local_28;
  FunctionBody *matchedFunctionBody;
  Utf8SourceInfo *pUStack_18;
  LocalFunctionId id_local;
  Utf8SourceInfo *this_local;
  
  local_28 = (FunctionBody *)0x0;
  matchedFunctionBody._4_4_ = id;
  pUStack_18 = this;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SynchronizedDictionary__
                      ((WriteBarrierPtr *)&this->functionBodyDictionary);
  if (*ppSVar2 !=
      (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
       *)0x0) {
    this_00 = Memory::
              WriteBarrierPtr<JsUtil::SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>_>
              ::operator->(&this->functionBodyDictionary);
    JsUtil::
    SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
    ::TryGetValue<unsigned_int>(this_00,(uint *)((long)&matchedFunctionBody + 4),&local_28);
    if ((local_28 == (FunctionBody *)0x0) ||
       (bVar1 = FunctionBody::IsPartialDeserializedFunction(local_28), bVar1)) {
      return (FunctionBody *)0x0;
    }
  }
  return local_28;
}

Assistant:

Js::FunctionBody* Utf8SourceInfo::FindFunction(Js::LocalFunctionId id) const
    {
        Js::FunctionBody *matchedFunctionBody = nullptr;

        if (this->functionBodyDictionary)
        {
            // Ignore return value - OK if function is not found.
            this->functionBodyDictionary->TryGetValue(id, &matchedFunctionBody);

            if (matchedFunctionBody == nullptr || matchedFunctionBody->IsPartialDeserializedFunction())
            {
                return nullptr;
            }
        }

        return matchedFunctionBody;
    }